

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__horizontal_resample_and_encode_first_scanline_from_scatter
               (stbir__info *stbir_info,stbir__per_split_info *split_info)

{
  int iVar1;
  float *input_buffer;
  int iVar2;
  
  input_buffer = stbir__get_ring_buffer_entry
                           (stbir_info,split_info,split_info->ring_buffer_begin_index);
  stbir__resample_horizontal_gather(stbir_info,split_info->vertical_buffer,input_buffer);
  stbir__encode_scanline
            (stbir_info,
             (void *)((long)stbir_info->output_stride_bytes *
                      (long)split_info->ring_buffer_first_scanline + (long)stbir_info->output_data),
             split_info->vertical_buffer,split_info->ring_buffer_first_scanline);
  *input_buffer = 3e+38;
  split_info->ring_buffer_first_scanline = split_info->ring_buffer_first_scanline + 1;
  iVar1 = split_info->ring_buffer_begin_index + 1;
  split_info->ring_buffer_begin_index = iVar1;
  iVar2 = 0;
  if (iVar1 != stbir_info->ring_buffer_num_entries) {
    iVar2 = iVar1;
  }
  split_info->ring_buffer_begin_index = iVar2;
  return;
}

Assistant:

static void stbir__horizontal_resample_and_encode_first_scanline_from_scatter(stbir__info const * stbir_info, stbir__per_split_info* split_info)
{
  // evict a scanline out into the output buffer

  float* ring_buffer_entry = stbir__get_ring_buffer_entry(stbir_info, split_info, split_info->ring_buffer_begin_index );

  // Now resample it into the buffer.
  stbir__resample_horizontal_gather( stbir_info, split_info->vertical_buffer, ring_buffer_entry  STBIR_ONLY_PROFILE_SET_SPLIT_INFO );

  // dump the scanline out
  stbir__encode_scanline( stbir_info, ( (char *)stbir_info->output_data ) + ( (size_t)split_info->ring_buffer_first_scanline * (size_t)stbir_info->output_stride_bytes ), split_info->vertical_buffer, split_info->ring_buffer_first_scanline  STBIR_ONLY_PROFILE_SET_SPLIT_INFO );

  // mark it as empty
  ring_buffer_entry[ 0 ] = STBIR__FLOAT_EMPTY_MARKER;

  // advance the first scanline
  split_info->ring_buffer_first_scanline++;
  if ( ++split_info->ring_buffer_begin_index == stbir_info->ring_buffer_num_entries )
    split_info->ring_buffer_begin_index = 0;
}